

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifSat.c
# Opt level: O0

void * If_ManSatBuildXYZ(int nLutSize)

{
  int iVar1;
  int iVar2;
  int iVar3;
  sat_solver *s;
  byte bVar4;
  sat_solver *p;
  undefined4 local_28;
  int iVarM;
  int m;
  int iVarP2;
  int iVarP1;
  int iVarP0;
  int nVars;
  int nMintsF;
  int nMintsL;
  int nLutSize_local;
  
  bVar4 = (byte)nLutSize;
  iVar1 = 1 << (bVar4 & 0x1f);
  iVar2 = 1 << (bVar4 * '\x03' - 2 & 0x1f);
  iVar3 = iVar1 * 2;
  s = sat_solver_new();
  sat_solver_setnvars(s,iVar1 * 3 + iVar2);
  for (local_28 = 0; local_28 < iVar2; local_28 = local_28 + 1) {
    sat_solver_add_mux41
              (s,iVar1 * 3 + local_28,local_28 % iVar1,iVar1 + (local_28 >> (bVar4 & 0x1f)) % iVar1,
               iVar3 + (local_28 >> ((byte)(nLutSize << 1) & 0x1f)) * 4,
               iVar3 + (local_28 >> ((byte)(nLutSize << 1) & 0x1f)) * 4 + 1,
               iVar3 + (local_28 >> ((byte)(nLutSize << 1) & 0x1f)) * 4 + 2,
               iVar3 + (local_28 >> ((byte)(nLutSize << 1) & 0x1f)) * 4 + 3);
  }
  return s;
}

Assistant:

void * If_ManSatBuildXYZ( int nLutSize )
{
    int nMintsL = (1 << nLutSize);
    int nMintsF = (1 << (3 * nLutSize - 2));
    int nVars   = 3 * nMintsL + nMintsF;
    int iVarP0  = 0;           // LUT0 parameters (total nMintsL)
    int iVarP1  = nMintsL;     // LUT1 parameters (total nMintsL)
    int iVarP2  = 2 * nMintsL; // LUT2 parameters (total nMintsL)
    int m,iVarM = 3 * nMintsL; // MUX vars        (total nMintsF)
    sat_solver * p = sat_solver_new();
    sat_solver_setnvars( p, nVars );
    for ( m = 0; m < nMintsF; m++ )
        sat_solver_add_mux41( p, 
            iVarM  + m,
            iVarP0 + m % nMintsL, 
            iVarP1 + (m >> nLutSize) % nMintsL, 
            iVarP2 + 4 * (m >> (2 * nLutSize)) + 0, 
            iVarP2 + 4 * (m >> (2 * nLutSize)) + 1, 
            iVarP2 + 4 * (m >> (2 * nLutSize)) + 2, 
            iVarP2 + 4 * (m >> (2 * nLutSize)) + 3 );
    return p;
}